

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

void entryClose(UResourceDataEntry *resB)

{
  umtx_lock_63(&resbMutex);
  while (resB != (UResourceDataEntry *)0x0) {
    resB->fCountExisting = resB->fCountExisting - 1;
    resB = resB->fParent;
  }
  umtx_unlock_63(&resbMutex);
  return;
}

Assistant:

static void entryClose(UResourceDataEntry *resB) {
  umtx_lock(&resbMutex);
  entryCloseInt(resB);
  umtx_unlock(&resbMutex);
}